

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saving.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  _Bind<void_(*(int))(int)> local_180;
  int local_16c;
  undefined1 local_168 [4];
  int i;
  thread_group threads;
  char **argv_local;
  int argc_local;
  
  threads.m.upgrade_cond.cond.__data.__g_signals = (uint  [2])argv;
  Py_Initialize();
  PyEval_InitThreads();
  uVar1 = PyGILState_GetThisThreadState();
  PyEval_ReleaseThread(uVar1);
  boost::thread_group::thread_group((thread_group *)local_168);
  for (local_16c = 0; local_16c < 100; local_16c = local_16c + 1) {
    std::bind<void(&)(int),int&>((_func_void_int *)&local_180,(int *)CallCommandFunc);
    boost::thread_group::create_thread<std::_Bind<void(*(int))(int)>>
              ((thread_group *)local_168,&local_180);
  }
  boost::thread_group::join_all((thread_group *)local_168);
  PyGILState_Ensure();
  Py_Finalize();
  boost::thread_group::~thread_group((thread_group *)local_168);
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{
    // Step 1: Initialize Python and enable thread support
    //
    // @note: It's important to ensure this is completed in the main thread of the application.
	Py_Initialize();
	PyEval_InitThreads();
	
    // Step 2: Release the GIL from the main thread so that other threads can use it
    PyEval_ReleaseThread(PyGILState_GetThisThreadState());
    
    // Step 3: Turn over to application processing
    boost::thread_group threads;
    for (int i = 0; i < 100; ++i)
    {
        threads.create_thread(std::bind(CallCommandFunc, i));
    }

    threads.join_all();
    
    // Step 4: Lock the GIL before calling finalize
    PyGILState_Ensure();
    Py_Finalize();

	return 0;
}